

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdaccount.cc
# Opt level: O2

void __thiscall bdAccount::resetStats(bdAccount *this)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  
  iVar1 = this->mNoStats;
  pdVar2 = (this->mLpfOut).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->mLpfRecv).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pdVar2[lVar4] = 0.0;
    pdVar3[lVar4] = 0.0;
  }
  iVar1 = this->mNoStats;
  pdVar2 = (this->mCountersOut).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->mCountersRecv).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pdVar2[lVar4] = 0.0;
    pdVar3[lVar4] = 0.0;
  }
  return;
}

Assistant:

void bdAccount::resetStats() {
	int i;
	for (i = 0; i < mNoStats; i++) {
		mLpfOut[i] = 0;
		mLpfRecv[i] = 0;
	}
	resetCounters();
}